

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O3

int __thiscall rr::TriangleRasterizer::init(TriangleRasterizer *this,EVP_PKEY_CTX *ctx)

{
  Winding WVar1;
  HorizontalFill HVar2;
  VerticalFill VVar3;
  int iVar4;
  undefined8 uVar5;
  long lVar6;
  int iVar7;
  float *in_RCX;
  long lVar8;
  int iVar9;
  float *in_RDX;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  uint uVar32;
  long local_50;
  long local_48;
  long local_40;
  
  uVar5 = *(undefined8 *)(ctx + 8);
  *(undefined8 *)(this->m_v0).m_data = *(undefined8 *)ctx;
  *(undefined8 *)((this->m_v0).m_data + 2) = uVar5;
  uVar5 = *(undefined8 *)(in_RDX + 2);
  *(undefined8 *)(this->m_v1).m_data = *(undefined8 *)in_RDX;
  *(undefined8 *)((this->m_v1).m_data + 2) = uVar5;
  uVar5 = *(undefined8 *)(in_RCX + 2);
  *(undefined8 *)(this->m_v2).m_data = *(undefined8 *)in_RCX;
  *(undefined8 *)((this->m_v2).m_data + 2) = uVar5;
  uVar32 = -(uint)(*(float *)ctx < 0.0);
  lVar17 = (long)(*(float *)ctx * 256.0 + (float)(~uVar32 & 0x3f000000 | uVar32 & 0xbf000000));
  uVar32 = -(uint)(*(float *)(ctx + 4) < 0.0);
  lVar22 = (long)(*(float *)(ctx + 4) * 256.0 + (float)(~uVar32 & 0x3f000000 | uVar32 & 0xbf000000))
  ;
  uVar32 = -(uint)(*in_RDX < 0.0);
  lVar14 = (long)(*in_RDX * 256.0 + (float)(~uVar32 & 0x3f000000 | uVar32 & 0xbf000000));
  uVar32 = -(uint)(in_RDX[1] < 0.0);
  lVar6 = (long)(in_RDX[1] * 256.0 + (float)(~uVar32 & 0x3f000000 | uVar32 & 0xbf000000));
  uVar32 = -(uint)(*in_RCX < 0.0);
  lVar11 = (long)(*in_RCX * 256.0 + (float)(~uVar32 & 0x3f000000 | uVar32 & 0xbf000000));
  uVar32 = -(uint)(in_RCX[1] < 0.0);
  lVar12 = (long)(in_RCX[1] * 256.0 + (float)(~uVar32 & 0x3f000000 | uVar32 & 0xbf000000));
  WVar1 = this->m_winding;
  HVar2 = this->m_horizontalFill;
  VVar3 = this->m_verticalFill;
  if (WVar1 == WINDING_CCW) {
    local_40 = lVar14 - lVar17;
    if (lVar6 == lVar22) {
      bVar31 = local_40 < 1;
      if (VVar3 == FILL_BOTTOM) {
        bVar31 = -1 < local_40;
      }
    }
    else {
      bVar30 = lVar6 - lVar22 < 0;
      bVar31 = !bVar30;
      if (HVar2 == FILL_LEFT) {
        bVar31 = lVar6 == lVar22 || bVar30;
      }
    }
    lVar8 = lVar22 - lVar6;
    (this->m_edge01).a = lVar8;
    (this->m_edge01).b = local_40;
    lVar24 = lVar6 * lVar17 - lVar14 * lVar22;
    (this->m_edge01).c = lVar24;
    (this->m_edge01).inclusive = bVar31;
    local_48 = lVar11 - lVar14;
    if (lVar12 == lVar6) {
      bVar30 = local_48 < 1;
      if (VVar3 == FILL_BOTTOM) {
        bVar30 = -1 < local_48;
      }
    }
    else {
      bVar27 = lVar12 - lVar6 < 0;
      bVar30 = !bVar27;
      if (HVar2 == FILL_LEFT) {
        bVar30 = lVar12 == lVar6 || bVar27;
      }
    }
    local_50 = lVar6 - lVar12;
    (this->m_edge12).a = local_50;
    (this->m_edge12).b = local_48;
    lVar20 = lVar12 * lVar14 - lVar11 * lVar6;
    (this->m_edge12).c = lVar20;
    (this->m_edge12).inclusive = bVar30;
    lVar25 = lVar17 - lVar11;
    if (lVar22 == lVar12) {
      bVar27 = lVar25 < 1;
      if (VVar3 == FILL_BOTTOM) {
        bVar27 = -1 < lVar25;
      }
    }
    else {
      bVar28 = lVar22 - lVar12 < 0;
      bVar27 = !bVar28;
      if (HVar2 == FILL_LEFT) {
        bVar27 = lVar22 == lVar12 || bVar28;
      }
    }
    lVar18 = lVar12 - lVar22;
    (this->m_edge20).a = lVar18;
    (this->m_edge20).b = lVar25;
    lVar23 = lVar11 * lVar22 - lVar12 * lVar17;
  }
  else {
    local_40 = lVar17 - lVar14;
    if (lVar22 == lVar6) {
      bVar30 = -1 < local_40;
      bVar31 = local_40 < 1;
      bVar27 = VVar3 == FILL_BOTTOM;
    }
    else {
      bVar31 = lVar22 - lVar6 < 0;
      bVar30 = lVar22 == lVar6 || bVar31;
      bVar31 = !bVar31;
      bVar27 = HVar2 == FILL_LEFT;
    }
    if (bVar27) {
      bVar31 = bVar30;
    }
    lVar8 = lVar6 - lVar22;
    (this->m_edge01).a = lVar8;
    (this->m_edge01).b = local_40;
    lVar24 = lVar14 * lVar22 - lVar6 * lVar17;
    (this->m_edge01).c = lVar24;
    (this->m_edge01).inclusive = bVar31;
    local_48 = lVar14 - lVar11;
    if (lVar6 == lVar12) {
      bVar27 = -1 < local_48;
      bVar30 = local_48 < 1;
      bVar28 = VVar3 == FILL_BOTTOM;
    }
    else {
      bVar30 = lVar6 - lVar12 < 0;
      bVar27 = lVar6 == lVar12 || bVar30;
      bVar30 = !bVar30;
      bVar28 = HVar2 == FILL_LEFT;
    }
    if (bVar28) {
      bVar30 = bVar27;
    }
    local_50 = lVar12 - lVar6;
    (this->m_edge12).a = local_50;
    (this->m_edge12).b = local_48;
    lVar20 = lVar11 * lVar6 - lVar12 * lVar14;
    (this->m_edge12).c = lVar20;
    (this->m_edge12).inclusive = bVar30;
    lVar25 = lVar11 - lVar17;
    if (lVar12 == lVar22) {
      bVar28 = -1 < lVar25;
      bVar27 = lVar25 < 1;
      bVar29 = VVar3 == FILL_BOTTOM;
    }
    else {
      bVar27 = lVar12 - lVar22 < 0;
      bVar28 = lVar12 == lVar22 || bVar27;
      bVar27 = !bVar27;
      bVar29 = HVar2 == FILL_LEFT;
    }
    if (bVar29) {
      bVar27 = bVar28;
    }
    lVar18 = lVar22 - lVar12;
    (this->m_edge20).a = lVar18;
    (this->m_edge20).b = lVar25;
    lVar23 = lVar12 * lVar17 - lVar11 * lVar22;
  }
  lVar26 = local_40 * lVar12 + lVar8 * lVar11 + lVar24;
  (this->m_edge20).c = lVar23;
  bVar28 = lVar26 < 0;
  if (WVar1 == WINDING_CCW) {
    bVar28 = 0 < lVar26;
  }
  (this->m_edge20).inclusive = bVar27;
  this->m_face = (uint)(byte)(this->m_viewportOrientation != VIEWPORTORIENTATION_UPPER_LEFT ^ bVar28
                             );
  if (bVar28 == false) {
    (this->m_edge01).a = -lVar8;
    (this->m_edge01).b = -local_40;
    (this->m_edge01).c = -lVar24;
    (this->m_edge01).inclusive = (bool)(bVar31 ^ 1);
    (this->m_edge12).a = -local_50;
    (this->m_edge12).b = -local_48;
    (this->m_edge12).c = -lVar20;
    (this->m_edge12).inclusive = (bool)(bVar30 ^ 1);
    (this->m_edge20).a = -lVar18;
    (this->m_edge20).b = -lVar25;
    (this->m_edge20).c = -lVar23;
    (this->m_edge20).inclusive = (bool)(bVar27 ^ 1);
  }
  lVar8 = lVar14;
  if (lVar17 < lVar14) {
    lVar8 = lVar17;
  }
  if (lVar14 < lVar17) {
    lVar14 = lVar17;
  }
  if (lVar11 <= lVar8) {
    lVar8 = lVar11;
  }
  if (lVar14 <= lVar11) {
    lVar14 = lVar11;
  }
  lVar11 = lVar6;
  if (lVar22 < lVar6) {
    lVar11 = lVar22;
  }
  if (lVar6 < lVar22) {
    lVar6 = lVar22;
  }
  if (lVar12 <= lVar11) {
    lVar11 = lVar12;
  }
  if (lVar6 <= lVar12) {
    lVar6 = lVar12;
  }
  lVar12 = 0xffffffff01;
  lVar17 = lVar12;
  if (HVar2 == FILL_LEFT) {
    lVar17 = 0xffffffff00;
  }
  lVar22 = -(ulong)(HVar2 == FILL_LEFT);
  if (lVar8 < 0) {
    lVar22 = lVar17;
  }
  if (VVar3 == FILL_BOTTOM) {
    lVar12 = 0xffffffff00;
  }
  lVar17 = -(ulong)(VVar3 == FILL_BOTTOM);
  if (lVar11 < 0) {
    lVar17 = lVar12;
  }
  uVar19 = (ulong)(HVar2 == FILL_RIGHT) + 0xff;
  if (lVar14 < 0) {
    uVar19 = (ulong)(HVar2 == FILL_RIGHT);
  }
  uVar16 = (ulong)(VVar3 == FILL_TOP) + 0xff;
  if (lVar6 < 0) {
    uVar16 = (ulong)(VVar3 == FILL_TOP);
  }
  iVar15 = (this->m_viewport).m_data[0];
  iVar4 = (this->m_viewport).m_data[1];
  iVar13 = (this->m_viewport).m_data[2] + iVar15 + -1;
  iVar7 = (int)((ulong)(lVar22 + lVar8) >> 8);
  iVar10 = iVar13;
  if (iVar7 < iVar13) {
    iVar10 = iVar7;
  }
  iVar21 = (this->m_viewport).m_data[3] + iVar4 + -1;
  if (iVar7 < iVar15) {
    iVar10 = iVar15;
  }
  iVar9 = (int)((ulong)(lVar17 + lVar11) >> 8);
  iVar7 = iVar21;
  if (iVar9 < iVar21) {
    iVar7 = iVar9;
  }
  if (iVar9 < iVar4) {
    iVar7 = iVar4;
  }
  iVar9 = (int)(uVar19 + lVar14 >> 8);
  if (iVar9 < iVar13) {
    iVar13 = iVar9;
  }
  if (iVar9 < iVar15) {
    iVar13 = iVar15;
  }
  (this->m_bboxMin).m_data[0] = iVar10;
  iVar15 = (int)(uVar16 + lVar6 >> 8);
  if (iVar15 < iVar21) {
    iVar21 = iVar15;
  }
  (this->m_bboxMin).m_data[1] = iVar7;
  if (iVar15 < iVar4) {
    iVar21 = iVar4;
  }
  (this->m_bboxMax).m_data[0] = iVar13;
  (this->m_bboxMax).m_data[1] = iVar21;
  uVar5 = *(undefined8 *)(this->m_bboxMin).m_data;
  *(undefined8 *)(this->m_curPos).m_data = uVar5;
  return (int)uVar5;
}

Assistant:

void TriangleRasterizer::init (const tcu::Vec4& v0, const tcu::Vec4& v1, const tcu::Vec4& v2)
{
	m_v0 = v0;
	m_v1 = v1;
	m_v2 = v2;

	// Positions in fixed-point coordinates.
	const deInt64	x0		= toSubpixelCoord(v0.x());
	const deInt64	y0		= toSubpixelCoord(v0.y());
	const deInt64	x1		= toSubpixelCoord(v1.x());
	const deInt64	y1		= toSubpixelCoord(v1.y());
	const deInt64	x2		= toSubpixelCoord(v2.x());
	const deInt64	y2		= toSubpixelCoord(v2.y());

	// Initialize edge functions.
	if (m_winding == WINDING_CCW)
	{
		initEdgeCCW(m_edge01, m_horizontalFill, m_verticalFill, x0, y0, x1, y1);
		initEdgeCCW(m_edge12, m_horizontalFill, m_verticalFill, x1, y1, x2, y2);
		initEdgeCCW(m_edge20, m_horizontalFill, m_verticalFill, x2, y2, x0, y0);
	}
	else
	{
		// Reverse edges
		initEdgeCCW(m_edge01, m_horizontalFill, m_verticalFill, x1, y1, x0, y0);
		initEdgeCCW(m_edge12, m_horizontalFill, m_verticalFill, x2, y2, x1, y1);
		initEdgeCCW(m_edge20, m_horizontalFill, m_verticalFill, x0, y0, x2, y2);
	}

	// Determine face.
	const deInt64	s				= evaluateEdge(m_edge01, x2, y2);
	const bool		positiveArea	= (m_winding == WINDING_CCW) ? (s > 0) : (s < 0);

	if (m_viewportOrientation == VIEWPORTORIENTATION_UPPER_LEFT)
		m_face = positiveArea ? FACETYPE_BACK : FACETYPE_FRONT;
	else
		m_face = positiveArea ? FACETYPE_FRONT : FACETYPE_BACK;

	if (!positiveArea)
	{
		// Reverse edges so that we can use CCW area tests & interpolation
		reverseEdge(m_edge01);
		reverseEdge(m_edge12);
		reverseEdge(m_edge20);
	}

	// Bounding box
	const deInt64	xMin	= de::min(de::min(x0, x1), x2);
	const deInt64	xMax	= de::max(de::max(x0, x1), x2);
	const deInt64	yMin	= de::min(de::min(y0, y1), y2);
	const deInt64	yMax	= de::max(de::max(y0, y1), y2);

	m_bboxMin.x() = floorSubpixelToPixelCoord	(xMin, m_horizontalFill	== FILL_LEFT);
	m_bboxMin.y() = floorSubpixelToPixelCoord	(yMin, m_verticalFill	== FILL_BOTTOM);
	m_bboxMax.x() = ceilSubpixelToPixelCoord	(xMax, m_horizontalFill	== FILL_RIGHT);
	m_bboxMax.y() = ceilSubpixelToPixelCoord	(yMax, m_verticalFill	== FILL_TOP);

	// Clamp to viewport
	const int		wX0		= m_viewport.x();
	const int		wY0		= m_viewport.y();
	const int		wX1		= wX0 + m_viewport.z() - 1;
	const int		wY1		= wY0 + m_viewport.w() -1;

	m_bboxMin.x() = de::clamp(m_bboxMin.x(), wX0, wX1);
	m_bboxMin.y() = de::clamp(m_bboxMin.y(), wY0, wY1);
	m_bboxMax.x() = de::clamp(m_bboxMax.x(), wX0, wX1);
	m_bboxMax.y() = de::clamp(m_bboxMax.y(), wY0, wY1);

	m_curPos = m_bboxMin;
}